

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::copy_fromHPresolveToHModelImplied(HModel *this,HPresolve *ptr_model)

{
  this->impliedBoundsPresolve = true;
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->primalColLowerImplied,&ptr_model->implColLower);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->primalColUpperImplied,&ptr_model->implColUpper);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->primalRowLowerImplied,&ptr_model->implRowValueLower);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->primalRowUpperImplied,&ptr_model->implRowValueUpper);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->dualColLowerImplied,&ptr_model->implColDualLower);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->dualColUpperImplied,&ptr_model->implColDualUpper);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->dualRowLowerImplied,&ptr_model->implRowDualLower);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->dualRowUpperImplied,&ptr_model->implRowDualUpper);
  return;
}

Assistant:

void HModel::copy_fromHPresolveToHModelImplied(HPresolve& ptr_model) {
    impliedBoundsPresolve = true;
    primalColLowerImplied = ptr_model.implColLower;
    primalColUpperImplied = ptr_model.implColUpper;
    primalRowLowerImplied = ptr_model.implRowValueLower;
    primalRowUpperImplied = ptr_model.implRowValueUpper;
    dualColLowerImplied = ptr_model.implColDualLower;
    dualColUpperImplied = ptr_model.implColDualUpper;
    dualRowLowerImplied = ptr_model.implRowDualLower;
    dualRowUpperImplied = ptr_model.implRowDualUpper;
}